

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pow_tests.cpp
# Opt level: O2

void pow_tests::sanity_check_chainparams(ArgsManager *args,ChainType chain_type)

{
  long lVar1;
  bool bVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  Params *pPVar4;
  arith_uint256 *paVar5;
  iterator pvVar6;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  undefined1 *puVar7;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  assertion_result local_360;
  char **local_348;
  assertion_result local_340;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  bool over;
  bool neg;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> chainParams;
  undefined1 local_208 [16];
  shared_count asStack_1f8 [2];
  arith_uint256 targ_max;
  arith_uint256 pow_compact;
  Params consensus;
  
  local_340.m_message.pn.pi_ = (sp_counted_base *)local_340.m_message.px;
  local_360.m_message.pn.pi_ = (sp_counted_base *)local_360.m_message.px;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CreateChainParams((ArgsManager *)&chainParams,(ChainType)args);
  Consensus::Params::Params
            (&consensus,
             (Params *)
             chainParams._M_t.
             super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>.
             _M_t.
             super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>.
             super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl);
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xa5;
  file.m_begin = (iterator)&local_220;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_230,msg);
  pow_compact.super_base_uint<256U>.pn[2]._0_1_ = 0;
  pow_compact.super_base_uint<256U>.pn._0_8_ = &PTR__lazy_ostream_011480b0;
  pow_compact.super_base_uint<256U>.pn._16_8_ = boost::unit_test::lazy_ostream::inst;
  pow_compact.super_base_uint<256U>.pn._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
  local_238 = "";
  CBlockHeader::GetHash
            ((uint256 *)&targ_max,
             (CBlockHeader *)
             ((long)chainParams._M_t.
                    super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                    .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl + 0x248));
  pvVar3 = (iterator)0x2;
  pPVar4 = &consensus;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&pow_compact,&local_240,0xa5,1,2,pPVar4,"consensus.hashGenesisBlock",
             (uint256 *)&targ_max,"chainParams->GenesisBlock().GetHash()");
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xa8;
  file_00.m_begin = (iterator)&local_250;
  msg_00.m_end = (iterator)pPVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_260,
             msg_00);
  pow_compact.super_base_uint<256U>.pn[2]._0_1_ = 0;
  pow_compact.super_base_uint<256U>.pn._0_8_ = &PTR__lazy_ostream_011480b0;
  pow_compact.super_base_uint<256U>.pn._16_8_ = boost::unit_test::lazy_ostream::inst;
  pow_compact.super_base_uint<256U>.pn._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
  local_268 = "";
  targ_max.super_base_uint<256U>.pn._0_8_ =
       consensus.nPowTargetTimespan % consensus.nPowTargetSpacing;
  paVar5 = &targ_max;
  puVar7 = local_208;
  local_208._0_8_ = (ulong)(uint)local_208._4_4_ << 0x20;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (&pow_compact,&local_270,0xa8,1,2,paVar5,
             "consensus.nPowTargetTimespan % consensus.nPowTargetSpacing",puVar7,"0");
  base_uint<256U>::base_uint(&pow_compact.super_base_uint<256U>);
  arith_uint256::SetCompact
            ((arith_uint256 *)&pow_compact.super_base_uint<256U>,
             *(uint32_t *)
              ((long)chainParams._M_t.
                     super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                     .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl + 0x290),&neg,
             &over);
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xae;
  file_01.m_begin = (iterator)&local_288;
  msg_01.m_end = (iterator)paVar5;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_298,
             msg_01);
  if (neg == false) {
    bVar2 = ::operator!=(&pow_compact.super_base_uint<256U>,0);
  }
  else {
    bVar2 = false;
  }
  stack0xfffffffffffffe00 = (undefined1  [16])0x0;
  local_360._0_8_ = "!neg && pow_compact != 0";
  local_360.m_message.px = (element_type *)0xbcd46f;
  targ_max.super_base_uint<256U>.pn[2]._0_1_ = 0;
  targ_max.super_base_uint<256U>.pn._0_8_ = &PTR__lazy_ostream_011481f0;
  targ_max.super_base_uint<256U>.pn._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
  local_2a0 = "";
  pvVar3 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  targ_max.super_base_uint<256U>.pn._24_8_ = &local_360;
  local_208[0] = bVar2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_208,(lazy_ostream *)&targ_max,1,0,WARN,(check_type)puVar7,
             (size_t)&local_2a8,0xae);
  boost::detail::shared_count::~shared_count((shared_count *)(local_208 + 0x10));
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0xaf;
  file_02.m_begin = (iterator)&local_2b8;
  msg_02.m_end = pvVar6;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2c8,
             msg_02);
  local_208._0_8_ = CONCAT71(local_208._1_7_,over) ^ 1;
  stack0xfffffffffffffe00 = (undefined1  [16])0x0;
  local_360._0_8_ = "!over";
  local_360.m_message.px = (element_type *)0xbcd475;
  targ_max.super_base_uint<256U>.pn[2]._0_1_ = 0;
  targ_max.super_base_uint<256U>.pn._0_8_ = &PTR__lazy_ostream_011481f0;
  targ_max.super_base_uint<256U>.pn._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
  local_2d0 = "";
  pvVar3 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  targ_max.super_base_uint<256U>.pn._24_8_ = &local_360;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_208,(lazy_ostream *)&targ_max,1,0,WARN,(check_type)puVar7,
             (size_t)&local_2d8,0xaf);
  boost::detail::shared_count::~shared_count((shared_count *)(local_208 + 0x10));
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xb0;
  file_03.m_begin = (iterator)&local_2e8;
  msg_03.m_end = pvVar6;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2f8,
             msg_03);
  UintToArith256(&targ_max,&consensus.powLimit);
  bVar2 = operator>=(&targ_max.super_base_uint<256U>,&pow_compact.super_base_uint<256U>);
  local_360.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar2;
  local_360.m_message.px = (element_type *)0x0;
  local_360.m_message.pn.pi_ = (sp_counted_base *)0x0;
  asStack_1f8[1].pi_ = (sp_counted_base *)&local_340;
  local_340._0_8_ = "UintToArith256(consensus.powLimit) >= pow_compact";
  local_340.m_message.px = (element_type *)0xbcd4a7;
  local_208._8_8_ = local_208._9_8_ << 8;
  local_208._0_8_ = &PTR__lazy_ostream_011481f0;
  asStack_1f8[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
  local_300 = "";
  pvVar3 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_360,(lazy_ostream *)local_208,1,0,WARN,(check_type)puVar7,(size_t)&local_308,
             0xb0);
  boost::detail::shared_count::~shared_count(&local_360.m_message.pn);
  if (consensus.fPowNoRetargeting == false) {
    asStack_1f8[0].pi_._0_4_ = 0xffffffff;
    asStack_1f8[0].pi_._4_4_ = 0xffffffff;
    asStack_1f8[1].pi_ = (sp_counted_base *)0xffffffffffffffff;
    local_208._0_8_ = (undefined **)0xffffffffffffffff;
    local_208._8_8_ = 0xffffffffffffffff;
    UintToArith256(&targ_max,(uint256 *)local_208);
    base_uint<256U>::base_uint((base_uint<256U> *)local_208,consensus.nPowTargetTimespan << 2);
    base_uint<256U>::operator/=(&targ_max.super_base_uint<256U>,(base_uint<256U> *)local_208);
    local_318 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
    local_310 = "";
    local_328 = &boost::unit_test::basic_cstring<char_const>::null;
    local_320 = &boost::unit_test::basic_cstring<char_const>::null;
    file_04.m_end = (iterator)0xb6;
    file_04.m_begin = (iterator)&local_318;
    msg_04.m_end = pvVar6;
    msg_04.m_begin = pvVar3;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_328,
               msg_04);
    UintToArith256((arith_uint256 *)local_208,&consensus.powLimit);
    bVar2 = ::operator<((base_uint<256U> *)local_208,&targ_max.super_base_uint<256U>);
    local_340.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)bVar2;
    local_340.m_message.px = (element_type *)0x0;
    local_340.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_348 = &local_370;
    local_370 = "UintToArith256(consensus.powLimit) < targ_max";
    local_368 = "";
    local_360.m_message.px = (element_type *)(local_360.m_message._1_8_ << 8);
    local_360._0_8_ = &PTR__lazy_ostream_011481f0;
    local_360.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_380 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
    local_378 = "";
    boost::test_tools::tt_detail::report_assertion
              (&local_340,(lazy_ostream *)&local_360,1,0,WARN,(check_type)puVar7,(size_t)&local_380,
               0xb6);
    boost::detail::shared_count::~shared_count(&local_340.m_message.pn);
  }
  Consensus::Params::~Params(&consensus);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            (&chainParams);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void sanity_check_chainparams(const ArgsManager& args, ChainType chain_type)
{
    const auto chainParams = CreateChainParams(args, chain_type);
    const auto consensus = chainParams->GetConsensus();

    // hash genesis is correct
    BOOST_CHECK_EQUAL(consensus.hashGenesisBlock, chainParams->GenesisBlock().GetHash());

    // target timespan is an even multiple of spacing
    BOOST_CHECK_EQUAL(consensus.nPowTargetTimespan % consensus.nPowTargetSpacing, 0);

    // genesis nBits is positive, doesn't overflow and is lower than powLimit
    arith_uint256 pow_compact;
    bool neg, over;
    pow_compact.SetCompact(chainParams->GenesisBlock().nBits, &neg, &over);
    BOOST_CHECK(!neg && pow_compact != 0);
    BOOST_CHECK(!over);
    BOOST_CHECK(UintToArith256(consensus.powLimit) >= pow_compact);

    // check max target * 4*nPowTargetTimespan doesn't overflow -- see pow.cpp:CalculateNextWorkRequired()
    if (!consensus.fPowNoRetargeting) {
        arith_uint256 targ_max{UintToArith256(uint256{"ffffffffffffffffffffffffffffffffffffffffffffffffffffffffffffffff"})};
        targ_max /= consensus.nPowTargetTimespan*4;
        BOOST_CHECK(UintToArith256(consensus.powLimit) < targ_max);
    }
}